

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O1

StackNode *
stack_node_new(StackNode *previous_node,Subtree subtree,_Bool is_pending,TSStateId state,
              StackNodeArray *pool)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  uint uVar6;
  undefined4 uVar7;
  StackNode **ppSVar5;
  StackNode *pSVar8;
  void *pvVar9;
  StackNode *extraout_RAX;
  StackNode *extraout_RAX_00;
  StackNode *extraout_RAX_01;
  int iVar10;
  ulong uVar11;
  SubtreePool *pool_00;
  SubtreePool *pool_01;
  Subtree *pSVar12;
  Subtree pool_02;
  StackNodeArray *pool_03;
  uint32_t uVar13;
  void *__ptr;
  ulong uVar14;
  uint32_t uVar15;
  StackNodeArray *__nmemb;
  ulong uVar16;
  void *pvVar17;
  Length result;
  int iStack_54;
  uint32_t uStack_50;
  undefined4 uStack_34;
  
  if (pool->size == 0) {
    __ptr = (void *)0xe8;
    pool_02 = subtree;
    pSVar8 = (StackNode *)malloc(0xe8);
    if (pSVar8 == (StackNode *)0x0) {
      stack_node_new_cold_1();
      do {
        if (*(int *)((long)__ptr + 0xd4) == 0) {
          __assert_fail("self->ref_count != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                        ,0x60,
                        "void stack_node_release(StackNode *, StackNodeArray *, SubtreePool *)");
        }
        uVar3 = *(int *)((long)__ptr + 0xd4) - 1;
        *(uint *)((long)__ptr + 0xd4) = uVar3;
        if (uVar3 != 0) {
          return (StackNode *)(ulong)uVar3;
        }
        if (*(ushort *)((long)__ptr + 0xd0) == 0) {
          pvVar17 = (void *)0x0;
        }
        else {
          uVar3 = *(ushort *)((long)__ptr + 0xd0) - 1;
          if (uVar3 != 0) {
            uVar16 = (ulong)uVar3;
            pSVar12 = (Subtree *)((long)__ptr + uVar16 * 0x18 + 0x18);
            do {
              uVar16 = uVar16 - 1;
              pSVar8 = (StackNode *)pSVar12[-1].ptr;
              if ((*pSVar12).ptr != (SubtreeHeapData *)0x0) {
                ts_subtree_release(pool_00,*pSVar12);
              }
              stack_node_release(pSVar8,(StackNodeArray *)pool_02.ptr,pool_00);
              pSVar12 = pSVar12 + -3;
            } while ((int)uVar16 != 0);
          }
          if ((*(Subtree *)((long)__ptr + 0x18)).ptr != (SubtreeHeapData *)0x0) {
            ts_subtree_release(pool_00,*(Subtree *)((long)__ptr + 0x18));
          }
          pvVar17 = *(void **)((long)__ptr + 0x10);
        }
        uVar3 = ((pool_02.ptr)->padding).extent.row;
        if (uVar3 < 0x32) {
          uVar2 = ((pool_02.ptr)->padding).extent.column;
          if (uVar3 == uVar2) {
            uVar3 = uVar2 * 2;
            if (uVar3 < 9) {
              uVar3 = 8;
            }
            if (uVar2 < uVar3) {
              __nmemb = (StackNodeArray *)(ulong)uVar3;
              if (*(void **)pool_02.ptr == (void *)0x0) {
                pool_03 = (StackNodeArray *)0x8;
                pvVar9 = calloc((size_t)__nmemb,8);
                if (pvVar9 == (void *)0x0) goto LAB_0012ef69;
              }
              else {
                __nmemb = (StackNodeArray *)((long)__nmemb << 3);
                pool_03 = __nmemb;
                pvVar9 = realloc(*(void **)pool_02.ptr,(size_t)__nmemb);
                if (pvVar9 == (void *)0x0) {
                  stack_node_release_cold_1();
LAB_0012ef69:
                  stack_node_release_cold_2();
                  if (__nmemb->contents == (StackNode **)0x0) {
                    return extraout_RAX_00;
                  }
                  if ((*(Subtree *)&__nmemb->size).ptr != (SubtreeHeapData *)0x0) {
                    ts_subtree_release(pool_01,*(Subtree *)&__nmemb->size);
                  }
                  ppSVar5 = __nmemb[1].contents;
                  if (ppSVar5 != (StackNode **)0x0) {
                    free(*ppSVar5);
                    *ppSVar5 = (StackNode *)0x0;
                    ppSVar5[1] = (StackNode *)0x0;
                    free(__nmemb[1].contents);
                  }
                  stack_node_release((StackNode *)__nmemb->contents,pool_03,pool_01);
                  return extraout_RAX_01;
                }
              }
              *(void **)pool_02.ptr = pvVar9;
              ((pool_02.ptr)->padding).extent.column = uVar3;
            }
          }
          pSVar8 = *(StackNode **)pool_02.ptr;
          uVar3 = ((pool_02.ptr)->padding).extent.row;
          ((pool_02.ptr)->padding).extent.row = uVar3 + 1;
          *(void **)((long)pSVar8->links + (ulong)uVar3 * 8 + -0x10) = __ptr;
        }
        else {
          free(__ptr);
          pSVar8 = extraout_RAX;
        }
        __ptr = pvVar17;
        if (pvVar17 == (void *)0x0) {
          return pSVar8;
        }
      } while( true );
    }
  }
  else {
    uVar3 = pool->size - 1;
    pool->size = uVar3;
    pSVar8 = pool->contents[uVar3];
  }
  pSVar8->state = state;
  memset(&pSVar8->field_0x2,0,0xd2);
  pSVar8->ref_count = 1;
  pSVar8->error_cost = 0;
  pSVar8->node_count = 0;
  *(undefined8 *)&pSVar8->dynamic_precedence = 0;
  if (previous_node == (StackNode *)0x0) {
    (pSVar8->position).bytes = 0;
    (pSVar8->position).extent.row = 0;
    (pSVar8->position).extent.column = 0;
    pSVar8->error_cost = 0;
  }
  else {
    pSVar8->link_count = 1;
    pSVar8->links[0].node = previous_node;
    pSVar8->links[0].subtree = subtree;
    pSVar8->links[0].is_pending = is_pending;
    uVar13 = (previous_node->position).extent.row;
    (pSVar8->position).bytes = (previous_node->position).bytes;
    (pSVar8->position).extent.row = uVar13;
    (pSVar8->position).extent.column = (previous_node->position).extent.column;
    uVar3 = previous_node->error_cost;
    pSVar8->error_cost = uVar3;
    iVar1 = previous_node->dynamic_precedence;
    pSVar8->dynamic_precedence = iVar1;
    uVar2 = previous_node->node_count;
    pSVar8->node_count = uVar2;
    if (subtree.ptr != (SubtreeHeapData *)0x0) {
      if (((ulong)subtree.ptr & 1) == 0) {
        uVar6 = *(uint *)&(subtree.ptr)->field_0x2c >> 7;
      }
      else {
        uVar6 = (uint)((ulong)subtree.ptr >> 5) & 0x7ffffff;
      }
      uVar13 = 0x262;
      if ((uVar6 & 1) == 0) {
        uVar13 = 0;
      }
      if ((char)(uVar6 & 1) == '\0' && ((ulong)subtree.ptr & 1) == 0) {
        uVar13 = (subtree.ptr)->error_cost;
      }
      pSVar8->error_cost = uVar13 + uVar3;
      if (((ulong)subtree.ptr & 1) == 0) {
        uVar3 = ((Length *)((long)subtree + 4))->bytes;
        uVar6 = (((Length *)((long)subtree + 4))->extent).row;
        uVar13 = ((subtree.ptr)->padding).extent.column;
      }
      else {
        uVar3 = subtree._2_4_ & 0xff;
        uVar6 = subtree._4_4_ >> 8 & 0xf;
        uVar13 = subtree._4_4_ & 0xff;
      }
      if (((ulong)subtree.ptr & 1) == 0) {
        uVar16._0_4_ = ((Length *)((long)subtree + 0x10))->bytes;
        uVar16._4_4_ = (((Length *)((long)subtree + 0x10))->extent).row;
        uVar15 = ((subtree.ptr)->size).extent.column;
        iVar10 = uVar16._4_4_;
      }
      else {
        uVar16 = (ulong)subtree.ptr >> 0x18 & 0xff;
        uVar15 = (uint32_t)uVar16;
        iVar10 = 0;
      }
      uVar14 = CONCAT44(uVar13,uVar6) + CONCAT44(uVar15,iVar10);
      uVar11 = uVar14 & 0xffffffff | (ulong)uVar15 << 0x20;
      if (iVar10 == 0) {
        uVar11 = uVar14;
      }
      iStack_54 = (int)uVar11;
      uVar4 = (pSVar8->position).bytes;
      uVar7 = (pSVar8->position).extent.row;
      uVar14 = CONCAT44((pSVar8->position).extent.column,uVar7) + uVar11;
      uVar11 = uVar14 & 0xffffffff | uVar11 & 0xffffffff00000000;
      if (iStack_54 == 0) {
        uVar11 = uVar14;
      }
      iStack_54 = (int)uVar11;
      uStack_50 = (uint32_t)(uVar11 >> 0x20);
      (pSVar8->position).bytes = (int)uVar16 + uVar3 + uVar4;
      (pSVar8->position).extent.row = iStack_54;
      (pSVar8->position).extent.column = uStack_50;
      if (((ulong)subtree.ptr & 1) == 0) {
        if ((subtree.ptr)->child_count == 0) {
          uVar13 = 1;
        }
        else {
          uVar13 = ((subtree.ptr)->field_17).field_0.node_count;
        }
        pSVar8->node_count = uVar13 + uVar2;
        iVar10 = 0;
        if ((((ulong)subtree.ptr & 1) == 0) && ((subtree.ptr)->child_count != 0)) {
          iVar10 = ((subtree.ptr)->field_17).field_0.dynamic_precedence;
        }
      }
      else {
        pSVar8->node_count = uVar2 + 1;
        iVar10 = 0;
      }
      pSVar8->dynamic_precedence = iVar10 + iVar1;
    }
  }
  return pSVar8;
}

Assistant:

static StackNode *stack_node_new(StackNode *previous_node, Subtree subtree,
                                 bool is_pending, TSStateId state, StackNodeArray *pool) {
  StackNode *node = pool->size > 0 ?
    array_pop(pool) :
    ts_malloc(sizeof(StackNode));
  *node = (StackNode){.ref_count = 1, .link_count = 0, .state = state};

  if (previous_node) {
    node->link_count = 1;
    node->links[0] = (StackLink){
      .node = previous_node,
      .subtree = subtree,
      .is_pending = is_pending,
    };

    node->position = previous_node->position;
    node->error_cost = previous_node->error_cost;
    node->dynamic_precedence = previous_node->dynamic_precedence;
    node->node_count = previous_node->node_count;

    if (subtree.ptr) {
      node->error_cost += ts_subtree_error_cost(subtree);
      node->position = length_add(node->position, ts_subtree_total_size(subtree));
      node->node_count += ts_subtree_node_count(subtree);
      node->dynamic_precedence += ts_subtree_dynamic_precedence(subtree);
    }
  } else {
    node->position = length_zero();
    node->error_cost = 0;
  }

  return node;
}